

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

void __thiscall
cs::domain_manager::add_var_no_return<std::__cxx11::string&>
          (domain_manager *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,var *val,
          bool is_override)

{
  stack_pointer psVar1;
  pointer pcVar2;
  domain_type *pdVar3;
  bool bVar4;
  runtime_error *prVar5;
  long *plVar6;
  error *peVar7;
  size_type *psVar8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  psVar1 = *this->fiber_stack;
  if (psVar1 == (stack_pointer)0x0) {
    pdVar3 = (this->m_data).m_current;
    if (pdVar3 == (this->m_data).m_start) {
      peVar7 = (error *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
      local_88._M_string_length = 5;
      cov::error::error(peVar7,&local_88);
      __cxa_throw(peVar7,&cov::error::typeinfo,cov::error::~error);
    }
    bVar4 = domain_type::add_var_optimal(pdVar3 + -1,name,val,is_override);
    if (!bVar4) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
      std::operator+(&local_48,"Target domain exist variable \"",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar8) {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88.field_2._8_8_ = plVar6[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar8;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      runtime_error::runtime_error(prVar5,&local_88);
      __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  else {
    if (psVar1->m_current == psVar1->m_start) {
      peVar7 = (error *)__cxa_allocate_exception(0x28);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88.field_2._M_allocated_capacity._0_6_ = 0x4830303045;
      local_88._M_string_length = 5;
      cov::error::error(peVar7,&local_88);
      __cxa_throw(peVar7,&cov::error::typeinfo,cov::error::~error);
    }
    bVar4 = domain_type::add_var_optimal(psVar1->m_current + -1,name,val,is_override);
    if (!bVar4) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar2 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + name->_M_string_length);
      std::operator+(&local_48,"Target domain exist variable \"",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88._M_dataplus._M_p = (pointer)*plVar6;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar8) {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88.field_2._8_8_ = plVar6[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar8;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      runtime_error::runtime_error(prVar5,&local_88);
      __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void add_var_no_return(T &&name, const var &val, bool is_override)
		{
			if (fiber_stack != nullptr) {
				if (!fiber_stack->top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
			else {
				if (!m_data.top().add_var_optimal(name, val, is_override))
					throw runtime_error("Target domain exist variable \"" + std::string(name) + "\".");
			}
		}